

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateMemCopy(Lowerer *this,Opnd *dst,Opnd *src,uint32 size,Instr *insertBeforeInstr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  IntConstOpnd *opndArg;
  Instr *instr;
  HelperCallOpnd *this_00;
  undefined4 *puVar5;
  LowererMD *this_01;
  
  pFVar1 = this->m_func;
  this_01 = &this->m_lowererMD;
  opndArg = IR::IntConstOpnd::New((ulong)size,TyUint32,pFVar1,false);
  LowererMD::LoadHelperArgument(this_01,insertBeforeInstr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(this_01,insertBeforeInstr,src);
  LowererMD::LoadHelperArgument(this_01,insertBeforeInstr,dst);
  instr = IR::Instr::New(Call,pFVar1);
  this_00 = IR::HelperCallOpnd::New(HelperMemCpy,pFVar1);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005c3e8e;
    *puVar5 = 0;
  }
  pFVar1 = instr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005c3e8e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &this_00->super_Opnd;
  IR::Instr::InsertBefore(insertBeforeInstr,instr);
  LowererMD::LowerCall(this_01,instr,3);
  return;
}

Assistant:

void
Lowerer::GenerateMemCopy(IR::Opnd * dst, IR::Opnd * src, uint32 size, IR::Instr * insertBeforeInstr)
{
    Func * func = this->m_func;
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, IR::IntConstOpnd::New(size, TyUint32, func));
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, src);
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, dst);
    IR::Instr * memcpyInstr = IR::Instr::New(Js::OpCode::Call, func);
    memcpyInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperMemCpy, func));
    insertBeforeInstr->InsertBefore(memcpyInstr);
    m_lowererMD.LowerCall(memcpyInstr, 3);
}